

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

void x86TestEncoding(uchar *codeLaunchHeader)

{
  undefined8 stream_00;
  int iVar1;
  int iVar2;
  uint instCount_00;
  ulong uVar3;
  x86Instruction *pos;
  uchar *puVar4;
  uchar *stream_01;
  x86Instruction *pxVar5;
  uchar *puVar6;
  uint extraout_EDX;
  x86Instruction *local_f28;
  uchar *stream2;
  uchar *buf2;
  undefined1 local_ef0 [4];
  uint i;
  OutputContext output;
  CodeGenRegVmStateContext vmState;
  char local_a98 [4];
  uint instCount;
  char instBuf [128];
  uint instBufSize;
  x86Instruction *instList;
  uint instSize;
  uchar *stream;
  CodeGenGenericContext ctx;
  uchar *buf;
  uint bufSize;
  uchar *codeLaunchHeader_local;
  
  ctx._2496_8_ = operator_new__(0x200000);
  CodeGenGenericContext::CodeGenGenericContext((CodeGenGenericContext *)&stream);
  stream_00 = ctx._2496_8_;
  uVar3 = SUB168(ZEXT816(0x40000) * ZEXT816(0x50),0);
  if (SUB168(ZEXT816(0x40000) * ZEXT816(0x50),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pos = (x86Instruction *)operator_new__(uVar3);
  local_f28 = pos;
  do {
    x86Instruction::x86Instruction(local_f28);
    local_f28 = local_f28 + 1;
  } while (local_f28 != pos + 0x40000);
  NULLC::fillMemory(pos,0,0x1400000);
  CodeGenGenericContext::SetLastInstruction((CodeGenGenericContext *)&stream,pos,pos);
  iVar1 = TestRptrXmmEncoding((CodeGenGenericContext *)&stream,(uchar *)stream_00,o_movss,x86MOVSS,1
                             );
  puVar4 = (uchar *)(stream_00 + (long)iVar1);
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_movsd,x86MOVSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_movsd,x86MOVSD,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_movsd,x86MOVSD,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_movd,x86MOVD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_movsxd,x86MOVSXD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtss2sd,x86CVTSS2SD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtss2sd,x86CVTSS2SD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtsd2ss,x86CVTSD2SS,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtsd2ss,x86CVTSD2SS);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvttsd2si,x86CVTTSD2SI,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvttsd2si64,x64CVTTSD2SI,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtsi2sd,x86CVTSI2SD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtsi2sd,x86CVTSI2SD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cvtsi2sd64,x64CVTSI2SD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_addsd,x86ADDSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_addsd,x86ADDSD,3);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_subsd,x86SUBSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_subsd,x86SUBSD,3);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_mulsd,x86MULSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_mulsd,x86MULSD,3);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_divsd,x86DIVSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_divsd,x86DIVSD,3);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_sqrtsd,x86SQRTSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmpeqsd,x86CMPEQSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmpltsd,x86CMPLTSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmplesd,x86CMPLESD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestXmmXmmEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmpneqsd,x86CMPNEQSD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_push,x86PUSH,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_push,x86PUSH);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_push,x86PUSH);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_pop,x86POP,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_pop,x86POP);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov,x86MOV,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov,x86MOV);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov,x86MOV,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov,x86MOV,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov,x86MOV,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNum64Encoding((CodeGenGenericContext *)&stream,puVar4,o_mov64,x64MOV);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov64,x64MOV);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov64,x86MOV,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov64,x86MOV,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_mov64,x86MOV,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_lea,x86LEA,3);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_neg,x86NEG,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_neg,x86NEG);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_neg64,x86NEG,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_neg64,x64NEG);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_add,x86ADD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_add,x86ADD,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_add,x86ADD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_add,x86ADD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_add,x86ADD,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_add64,x64ADD);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_add64,x64ADD,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_add64,x86ADD,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_add64,x86ADD,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_add64,x86ADD,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_adc,x86ADC);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_adc,x86ADC,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_adc,x86ADC,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_adc,x86ADC,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub,x86SUB);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub,x86SUB,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub,x86SUB,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub,x86SUB,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub64,x64SUB);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub64,x64SUB,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub64,x86SUB,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sub64,x86SUB,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sbb,x86SBB,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sbb,x86SBB);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sbb,x86SBB,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sbb,x86SBB,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul,x86IMUL);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul,x86IMUL);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul,x86IMUL,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul,x86IMUL,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul64,x64IMUL);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_imul64,x86IMUL,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_idiv,x86IDIV,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_idiv,x86IDIV);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_idiv64,x86IDIV,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_idiv64,x64IDIV);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_shl,x86SHL,true);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_shl,x86SHL,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sal,x86SAL);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sal,x86SAL,true);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sal64,x64SAL);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sal64,x64SAL,true);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sar,x86SAR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sar,x86SAR,true);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_sar64,x64SAR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_sar64,x64SAR,true);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_not,x86NOT,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_not,x86NOT);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_not64,x86NOT,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_not64,x64NOT);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_and,x86AND);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_and,x86AND,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_and,x86AND,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_and,x86AND,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_and,x86AND,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_and64,x64AND);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_and64,x86AND,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_and64,x86AND,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_and64,x86AND,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_or,x86OR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_or,x86OR,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_or,x86OR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_or,x86OR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_or,x86OR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_or64,x64OR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_or64,x86OR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_or64,x86OR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_or64,x86OR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor,x86XOR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor,x86XOR,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor,x86XOR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor,x86XOR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor,x86XOR,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor64,x64XOR);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor64,x86XOR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor64,x86XOR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_xor64,x86XOR,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp,x86CMP);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp,x86CMP,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp,x86CMP,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp,x86CMP,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp,x86CMP,1);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp64,x64CMP);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp64,x64CMP,false);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRptrEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp64,x86CMP,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp64,x86CMP,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRptrNumEncoding((CodeGenGenericContext *)&stream,puVar4,o_cmp64,x86CMP,2);
  puVar4 = puVar4 + iVar1;
  iVar1 = TestRegRegEncoding((CodeGenGenericContext *)&stream,puVar4,o_test,x86TEST);
  iVar2 = TestRegEncoding((CodeGenGenericContext *)&stream,puVar4 + iVar1,o_call,x86CALL);
  stream_01 = puVar4 + iVar1 + iVar2;
  puVar4 = stream_01;
  iVar1 = TestRptrEncoding((CodeGenGenericContext *)&stream,stream_01,o_call,x86CALL,2);
  if ((uchar *)(ctx._2496_8_ + 0x200000) <= stream_01 + iVar1) {
    __assert_fail("stream < buf + bufSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1044,"void x86TestEncoding(unsigned char *)");
  }
  pxVar5 = CodeGenGenericContext::GetLastInstruction((CodeGenGenericContext *)&stream);
  instCount_00 = (int)((ulong)((long)pxVar5 - (long)pos) >> 4) * -0x33333333;
  CodeGenRegVmStateContext::CodeGenRegVmStateContext
            ((CodeGenRegVmStateContext *)&output.closeStream);
  OutputContext::OutputContext((OutputContext *)local_ef0);
  output._536_8_ = (*(code *)output.stream)("asmX86_test.txt");
  for (buf2._4_4_ = 0; buf2._4_4_ < instCount_00; buf2._4_4_ = buf2._4_4_ + 1) {
    x86Instruction::Decode
              (pos + buf2._4_4_,(CodeGenRegVmStateContext *)&output.closeStream,local_a98,0x80);
    OutputContext::Print((OutputContext *)local_ef0,local_a98);
    puVar4 = (uchar *)0xa;
    OutputContext::Print((OutputContext *)local_ef0,'\n');
  }
  OutputContext::Flush((OutputContext *)local_ef0);
  (*output.writeStream)((void *)output._536_8_,(char *)puVar4,extraout_EDX);
  output.tempBufSize = 0;
  output._540_4_ = 0;
  puVar4 = (uchar *)operator_new__(0x200000);
  puVar6 = x86TranslateInstructionList(puVar4,puVar4 + 0x200000,pos,instCount_00,(uchar **)0x0);
  iVar1 = (int)(stream_01 + iVar1);
  if ((int)puVar6 - (int)puVar4 != iVar1 - ctx.lockedXmmRegB) {
    __assert_fail("unsigned(stream2 - buf2) == unsigned(stream - buf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1062,"void x86TestEncoding(unsigned char *)");
  }
  iVar1 = memcmp((void *)ctx._2496_8_,puVar4,(ulong)(iVar1 - ctx.lockedXmmRegB));
  if (iVar1 != 0) {
    __assert_fail("memcmp(buf, buf2, unsigned(stream - buf)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1065,"void x86TestEncoding(unsigned char *)");
  }
  OutputContext::~OutputContext((OutputContext *)local_ef0);
  return;
}

Assistant:

void x86TestEncoding(unsigned char *codeLaunchHeader)
{
	(void)codeLaunchHeader;

	// clang takes an extreemely long time to optimize this function
#if !defined(NDEBUG)
	unsigned bufSize = 2048 * 1024;
	unsigned char *buf = new unsigned char[bufSize];

	CodeGenGenericContext ctx;
	unsigned char *stream = buf;

	unsigned instSize = 256 * 1024;
	x86Instruction *instList = new x86Instruction[instSize];
	NULLC::fillMemory(instList, 0, instSize * sizeof(x86Instruction));
	ctx.SetLastInstruction(instList, instList);

	stream += TestRptrXmmEncoding(ctx, stream, o_movss, x86MOVSS, testSizeDword);

	stream += TestXmmXmmEncoding(ctx, stream, o_movsd, x86MOVSD);
	stream += TestRptrXmmEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);
	stream += TestXmmRptrEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);

	stream += TestRegXmmEncoding(ctx, stream, o_movd, x86MOVD);

	stream += TestRegRptrEncoding(ctx, stream, o_movsxd, x86MOVSXD, testSizeDword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD, testSizeDword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS, testSizeQword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si, x86CVTTSD2SI, testSizeQword);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si64, x64CVTTSD2SI, testSizeQword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD, testSizeDword);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd64, x64CVTSI2SD);

	stream += TestXmmXmmEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_divsd, x86DIVSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_divsd, x86DIVSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_sqrtsd, x86SQRTSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_cmpeqsd, x86CMPEQSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpltsd, x86CMPLTSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmplesd, x86CMPLESD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpneqsd, x86CMPNEQSD);

#if defined(_M_X64)
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#else
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#endif

	stream += TestRegNumEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);

	stream += TestRegNum64Encoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);

	//stream += TestRegRptrEncoding(ctx, stream, o_movsx, x86MOVSX);

	stream += TestRegRptrEncoding(ctx, stream, o_lea, x86LEA);

	stream += TestRptrEncoding(ctx, stream, o_neg, x86NEG, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_neg, x86NEG);

	stream += TestRptrEncoding(ctx, stream, o_neg64, x86NEG, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_neg64, x64NEG);

	stream += TestRegRegEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_add, x86ADD, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRegNumEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRptrRegEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);

	stream += TestRegNumEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRegRegEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRptrRegEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegNumEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul, x86IMUL, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_imul64, x64IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul64, x86IMUL, testSizeQword);

	stream += TestRptrEncoding(ctx, stream, o_idiv, x86IDIV, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_idiv, x86IDIV);

	stream += TestRptrEncoding(ctx, stream, o_idiv64, x86IDIV, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_idiv64, x64IDIV);

	stream += TestRegNumEncoding(ctx, stream, o_shl, x86SHL, true);
	stream += TestRptrNumEncoding(ctx, stream, o_shl, x86SHL, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_sal, x86SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal, x86SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sal64, x64SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal64, x64SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sar, x86SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar, x86SAR, true);

	stream += TestRegEncoding(ctx, stream, o_sar64, x64SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar64, x64SAR, true);

	stream += TestRptrEncoding(ctx, stream, o_not, x86NOT, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_not, x86NOT);

	stream += TestRptrEncoding(ctx, stream, o_not64, x86NOT, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_not64, x64NOT);

	stream += TestRegRegEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegNumEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_and, x86AND, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_and64, x64AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_and64, x86AND, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegNumEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_or, x86OR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_or64, x64OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_or64, x86OR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegNumEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_xor64, x64XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_test, x86TEST);

	stream += TestRegEncoding(ctx, stream, o_call, x86CALL);
	stream += TestRptrEncoding(ctx, stream, o_call, x86CALL, testSizeQword);

	assert(stream < buf + bufSize);

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	unsigned instCount = unsigned(ctx.GetLastInstruction() - instList);

	CodeGenRegVmStateContext vmState;

	vmState.vsAsmStyle = true;

	OutputContext output;
	output.stream = output.openStream("asmX86_test.txt");

	for(unsigned i = 0; i < instCount; i++)
	{
		instList[i].Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
	output.closeStream(output.stream);
	output.stream = NULL;

	unsigned char *buf2 = new unsigned char[bufSize];

	unsigned char *stream2 = x86TranslateInstructionList(buf2, buf2 + bufSize, instList, instCount, NULL);

	assert(unsigned(stream2 - buf2) == unsigned(stream - buf));
	(void)stream2;

	assert(memcmp(buf, buf2, unsigned(stream - buf)) == 0);

	/*DWORD oldProtect;
	VirtualProtect((void*)buf, unsigned(stream - buf), PAGE_EXECUTE_READWRITE, (DWORD*)&oldProtect);

	uintptr_t regFilePtr[8];

	typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, uintptr_t *regFilePtr);
	nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
	gate(buf, regFilePtr);*/
#endif
}